

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::Person(Person *this,Person *p)

{
  Person *p_local;
  Person *this_local;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_0010ad00;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->id);
  Address::Address(&this->address);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&p->name);
  std::__cxx11::string::operator=((string *)&this->id,(string *)&p->id);
  Address::operator=(&this->address,&p->address);
  return;
}

Assistant:

Person::Person(const Person &p) {
    name = p.name;
    id = p.id;
    address = p.address;
}